

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O3

Aig_Man_t * Aig_ManSplit(Aig_Man_t *p,int nVars,int fVerbose)

{
  void **ppvVar1;
  int iVar2;
  uint uVar3;
  Aig_Man_t *vVec;
  DdManager *dd;
  Vec_Ptr_t *vSubset;
  Vec_Ptr_t *vCofs;
  Aig_Man_t *pAVar4;
  long lVar5;
  long lVar6;
  int level;
  char *__s;
  timespec ts;
  DdNode *local_50;
  timespec local_48;
  DdNode *local_38;
  
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (p->nTruePos != 1) {
    __s = "Currently works only for one primary output.";
LAB_006480d5:
    puts(__s);
    return (Aig_Man_t *)0x0;
  }
  if (nVars < 1) {
    __s = "The number of cofactoring variables should be a positive number.";
    goto LAB_006480d5;
  }
  if (0x10 < (uint)nVars) {
    __s = "The number of cofactoring variables should be less than 17.";
    goto LAB_006480d5;
  }
  if (p->vCos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  vVec = (Aig_Man_t *)
         Aig_Support(p,(Aig_Obj_t *)(*(ulong *)((long)*p->vCos->pArray + 8) & 0xfffffffffffffffe));
  if (*(int *)((long)&vVec->pName + 4) == 0) {
    puts("Property output function is a constant.");
    if ((void **)vVec->pSpec != (void **)0x0) {
      free(vVec->pSpec);
    }
    free(vVec);
    return (Aig_Man_t *)0x0;
  }
  dd = Aig_ManBuildPoBdd(p,&local_50);
  if (fVerbose != 0) {
    iVar2 = *(int *)((long)&vVec->pName + 4);
    uVar3 = Cudd_DagSize(local_50);
    printf("Support =%5d.  BDD size =%6d.  ",iVar2,(ulong)uVar3);
  }
  pAVar4 = vVec;
  vSubset = Aig_ManVecRandSubset((Vec_Ptr_t *)vVec,nVars);
  iVar2 = vSubset->nSize;
  if (0 < (long)iVar2) {
    ppvVar1 = vSubset->pArray;
    lVar6 = 0;
    do {
      ppvVar1[lVar6] = *(void **)((long)ppvVar1[lVar6] + 0x28);
      lVar6 = lVar6 + 1;
    } while (iVar2 != lVar6);
  }
  local_38 = local_50;
  vCofs = Aig_ManCofactorBdds(pAVar4,vSubset,dd,local_50);
  pAVar4 = Aig_ManConvertBddsToAigs(p,dd,vCofs);
  if ((void **)vVec->pSpec != (void **)0x0) {
    free(vVec->pSpec);
  }
  free(vVec);
  if (vSubset->pArray != (void **)0x0) {
    free(vSubset->pArray);
  }
  free(vSubset);
  if (fVerbose != 0) {
    printf("Created %d cofactors (out of %d).  ",(ulong)(uint)pAVar4->nTruePos,
           (ulong)(uint)vCofs->nSize);
    level = 3;
    iVar2 = clock_gettime(3,&local_48);
    if (iVar2 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
  }
  Cudd_RecursiveDeref(dd,local_38);
  iVar2 = vCofs->nSize;
  ppvVar1 = vCofs->pArray;
  if ((long)iVar2 < 1) {
    if (ppvVar1 == (void **)0x0) goto LAB_006482e5;
  }
  else {
    lVar5 = 0;
    do {
      Cudd_RecursiveDeref(dd,(DdNode *)ppvVar1[lVar5]);
      lVar5 = lVar5 + 1;
    } while (iVar2 != lVar5);
  }
  free(ppvVar1);
LAB_006482e5:
  free(vCofs);
  Extra_StopManager(dd);
  return pAVar4;
}

Assistant:

Aig_Man_t * Aig_ManSplit( Aig_Man_t * p, int nVars, int fVerbose )
{
    Aig_Man_t * pRes;
    Aig_Obj_t * pNode;
    DdNode * bFunc;
    DdManager * dd;
    Vec_Ptr_t * vSupp, * vSubs, * vCofs;
    int i;
    abctime clk = Abc_Clock();
    if ( Saig_ManPoNum(p) != 1 )
    {
        printf( "Currently works only for one primary output.\n" );
        return NULL;
    }
    if ( nVars < 1 )
    {
        printf( "The number of cofactoring variables should be a positive number.\n" );
        return NULL;
    }
    if ( nVars > 16 )
    {
        printf( "The number of cofactoring variables should be less than 17.\n" );
        return NULL;
    }
    vSupp = Aig_Support( p, Aig_ObjFanin0(Aig_ManCo(p,0)) );
    if ( Vec_PtrSize(vSupp) == 0 )
    {
        printf( "Property output function is a constant.\n" );
        Vec_PtrFree( vSupp );
        return NULL;
    }
    dd    = Aig_ManBuildPoBdd( p, &bFunc ); // bFunc is referenced
    if ( fVerbose )
        printf( "Support =%5d.  BDD size =%6d.  ", Vec_PtrSize(vSupp), Cudd_DagSize(bFunc) );
    vSubs = Aig_ManVecRandSubset( vSupp, nVars );
    // replace nodes by their BDD variables
    Vec_PtrForEachEntry( Aig_Obj_t *, vSubs, pNode, i )
        Vec_PtrWriteEntry( vSubs, i, pNode->pData );
    // derive cofactors and functions
    vCofs = Aig_ManCofactorBdds( p, vSubs, dd, bFunc );
    pRes  = Aig_ManConvertBddsToAigs( p, dd, vCofs );
    Vec_PtrFree( vSupp );
    Vec_PtrFree( vSubs );
    if ( fVerbose )
        printf( "Created %d cofactors (out of %d).  ", Saig_ManPoNum(pRes), Vec_PtrSize(vCofs) );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // dereference
    Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrForEachEntry( DdNode *, vCofs, bFunc, i )
        Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vCofs );
    Extra_StopManager( dd );
    return pRes;
}